

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall llm_graph_context::build_inp_attn_scale(llm_graph_context *this)

{
  pointer plVar1;
  long lVar2;
  int64_t iVar3;
  ggml_tensor *pgVar4;
  pointer this_00;
  llm_graph_context *in_RDI;
  ggml_tensor **cur;
  __single_object inp;
  llm_graph_input_ptr *in_stack_ffffffffffffff88;
  unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *this_01;
  uint *in_stack_ffffffffffffffb0;
  long *in_stack_ffffffffffffffb8;
  ggml_context *pgVar5;
  unique_ptr<llm_graph_input_attn_temp,_std::default_delete<llm_graph_input_attn_temp>_>
  local_38 [3];
  ggml_tensor **local_20;
  int64_t local_18;
  unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_10 [2];
  
  local_18 = n_pos_per_token(in_RDI);
  this_01 = local_10;
  std::make_unique<llm_graph_input_attn_temp,long,unsigned_int_const&,float_const&>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(float *)in_RDI);
  plVar1 = std::
           unique_ptr<llm_graph_input_attn_temp,_std::default_delete<llm_graph_input_attn_temp>_>::
           operator->((unique_ptr<llm_graph_input_attn_temp,_std::default_delete<llm_graph_input_attn_temp>_>
                       *)0x4348f8);
  local_20 = &plVar1->attn_scale;
  pgVar5 = in_RDI->ctx0;
  lVar2 = (long)in_RDI->n_tokens;
  iVar3 = n_pos_per_token(in_RDI);
  pgVar4 = (ggml_tensor *)ggml_new_tensor_3d(pgVar5,0,1,1,lVar2 * iVar3);
  *local_20 = pgVar4;
  ggml_set_input(*local_20);
  this_00 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x434974);
  std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>::
  unique_ptr<llm_graph_input_attn_temp,std::default_delete<llm_graph_input_attn_temp>,void>
            (this_01,local_38);
  llm_graph_result::add_input(this_00,in_stack_ffffffffffffff88);
  std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)this_00);
  pgVar4 = *local_20;
  std::unique_ptr<llm_graph_input_attn_temp,_std::default_delete<llm_graph_input_attn_temp>_>::
  ~unique_ptr((unique_ptr<llm_graph_input_attn_temp,_std::default_delete<llm_graph_input_attn_temp>_>
               *)this_00);
  return pgVar4;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_attn_scale() const {
    auto inp = std::make_unique<llm_graph_input_attn_temp>(n_pos_per_token(), hparams.n_attn_temp_floor_scale, hparams.f_attn_temp_scale);

    auto & cur = inp->attn_scale;

    cur = ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, 1, 1, n_tokens*n_pos_per_token());
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}